

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  TargetType targetType;
  string *psVar7;
  undefined4 extraout_var;
  char *pcVar8;
  ostream *poVar9;
  cmGlobalNinjaGenerator *pcVar10;
  char *pcVar11;
  char *__s;
  char *__s_00;
  string *i_1;
  _Alloc_hider str;
  cmOutputConverter *pcVar12;
  string *i;
  pointer pbVar13;
  allocator<char> local_7c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  char local_7b2;
  char local_7b1;
  cmMakefile *local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  string compilerLauncher;
  string run_iwyu;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ddCmds;
  string cmdLine;
  string ppRspFile;
  string ppCmdLine;
  string cldeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string depfile;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string deptype;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  string rspcontent;
  string responseFlag;
  string flags;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8 [22];
  ostringstream description;
  size_type local_438;
  string launcher;
  string tdi;
  string rspfile;
  RuleVariables local_158;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_158);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_158.CMTargetName = (psVar7->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_158.CMTargetType = cmState::GetTargetTypeName(targetType);
  local_158.Language = (lang->_M_dataplus)._M_p;
  local_158.Source = "$in";
  local_158.Object = "$out";
  local_158.Defines = "$DEFINES";
  local_158.Includes = "$INCLUDES";
  local_158.TargetPDB = "$TARGET_PDB";
  local_158.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_158.ObjectDir = "$OBJECT_DIR";
  local_158.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_7c0 = lang;
  bVar6 = std::operator==(lang,"Swift");
  pbVar3 = local_7c0;
  if (bVar6) {
    local_158.SwiftAuxiliarySources = "$SWIFT_AUXILIARY_SOURCES";
    local_158.SwiftModuleName = "$SWIFT_MODULE_NAME";
    local_158.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
    local_158.SwiftPartialModule = "$SWIFT_PARTIAL_MODULE";
    local_158.SwiftPartialDoc = "$SWIFT_PARTIAL_DOC";
  }
  local_7b1 = std::operator==(local_7c0,"Fortran");
  local_7b2 = std::operator==(pbVar3,"Fortran");
  local_7b0 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"$FLAGS",(allocator<char> *)&comment);
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  bVar6 = std::operator==(pbVar3,"RC");
  if (((!bVar6) && (bVar6 = std::operator==(local_7c0,"CUDA"), !bVar6)) &&
     (bVar6 = ForceResponseFile(this), bVar6)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"CMAKE_",local_7c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"_RESPONSE_FILE_FLAG");
    std::__cxx11::string::~string((string *)&description);
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,(string *)&comment)
    ;
    std::__cxx11::string::_M_assign((string *)&responseFlag);
    if (responseFlag._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&responseFlag);
    }
    std::__cxx11::string::~string((string *)&comment);
  }
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
       (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
         _vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
  pcVar1 = this->LocalGenerator;
  GetTargetDependInfoPath((string *)&description,this,local_7c0);
  ConvertToNinjaPath((string *)&comment,this,(string *)&description);
  cmOutputConverter::ConvertToOutputFormat
            (&tdi,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter,(string *)&comment,SHELL);
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::string::~string((string *)&description);
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar1 = this->LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&comment,"RULE_LAUNCH_COMPILE",(allocator<char> *)&description);
  pcVar8 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar1,pcVar2,(string *)&comment);
  std::__cxx11::string::~string((string *)&comment);
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::string::assign((char *)&launcher);
    std::__cxx11::string::append((char *)&launcher);
  }
  if (local_7b1 != '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "CMAKE_",local_7c0);
    std::operator+(&rspcontent,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   "_PREPROCESS_SOURCE");
    std::__cxx11::string::~string((string *)&comment);
    psVar7 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&rspcontent);
    deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
    deptype._M_string_length = 0;
    deptype.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&depfile,"$DEP_FILE",(allocator<char> *)&comment);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&rspfile);
    rspfile._M_dataplus._M_p = local_158.CMTargetName;
    rspfile._M_string_length = (size_type)local_158.CMTargetType;
    local_158.Source = "$in";
    std::__cxx11::string::string((string *)&cldeps,(string *)&flags);
    pcVar11 = local_158.Includes;
    pcVar8 = local_158.Defines;
    ppRspFile._M_dataplus._M_p = (pointer)&ppRspFile.field_2;
    ppRspFile._M_string_length = 0;
    local_158.Defines = "";
    ppRspFile.field_2._M_local_buf[0] = '\0';
    compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
    compilerLauncher._M_string_length = 0;
    compilerLauncher.field_2._M_local_buf[0] = '\0';
    if (responseFlag._M_string_length != 0) {
      std::__cxx11::string::assign((char *)&ppRspFile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8," ",(allocator<char> *)&ddCmds);
      std::operator+(&run_iwyu,&local_7a8,pcVar8);
      std::operator+(&ppCmdLine,&run_iwyu," ");
      std::operator+(&cmdLine,&ppCmdLine,pcVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,&cmdLine," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &description,&cldeps);
      std::__cxx11::string::operator=((string *)&compilerLauncher,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&cmdLine);
      std::__cxx11::string::~string((string *)&ppCmdLine);
      std::__cxx11::string::~string((string *)&run_iwyu);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &responseFlag,&ppRspFile);
      std::__cxx11::string::operator=((string *)&cldeps,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
    }
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(psVar7,&ppCmds,false);
    pbVar5 = ppCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = ppCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar5;
        pbVar13 = pbVar13 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     &launcher,pbVar13);
      std::__cxx11::string::operator=((string *)pbVar13,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      pcVar12 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar12 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar12,
                 pbVar13,(RuleVariables *)&rspfile);
    }
    pcVar1 = this->LocalGenerator;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&cmdLine,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar7,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddCmds,
                   &cmdLine," -E cmake_ninja_depends --tdi=");
    std::operator+(&local_7a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddCmds,&tdi
                  );
    std::operator+(&run_iwyu,&local_7a8," --lang=");
    std::operator+(&ppCmdLine,&run_iwyu,local_7c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&ppCmdLine," --pp=$out --dep=$DEP_FILE");
    pcVar8 = "";
    if (local_7b2 != '\0') {
      pcVar8 = " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,pcVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&run_iwyu);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&ddCmds);
    _comment = (pointer)local_5a8;
    local_5a8[0]._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&ppCmdLine,this->LocalGenerator,&ppCmds,(string *)&comment,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar9 = std::operator<<((ostream *)&comment,"Rule for preprocessing ");
    poVar9 = std::operator<<(poVar9,(string *)local_7c0);
    std::operator<<(poVar9," files.");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar9 = std::operator<<((ostream *)&description,"Building ");
    poVar9 = std::operator<<(poVar9,(string *)local_7c0);
    std::operator<<(poVar9," preprocessed $out");
    pcVar10 = GetGlobalGenerator(this);
    LanguagePreprocessRule(&run_iwyu,this,local_7c0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>((string *)&compileCmds,"",&local_7c1);
    cmGlobalNinjaGenerator::AddRule
              (pcVar10,&run_iwyu,&ppCmdLine,&local_7a8,(string *)&ddCmds,&depfile,&deptype,
               &ppRspFile,&compilerLauncher,(string *)&compileCmds,false);
    std::__cxx11::string::~string((string *)&compileCmds);
    std::__cxx11::string::~string((string *)&ddCmds);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&run_iwyu);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&cmdLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppCmds);
    std::__cxx11::string::~string((string *)&compilerLauncher);
    std::__cxx11::string::~string((string *)&ppRspFile);
    std::__cxx11::string::~string((string *)&cldeps);
    std::__cxx11::string::~string((string *)&depfile);
    std::__cxx11::string::~string((string *)&deptype);
    std::__cxx11::string::~string((string *)&rspcontent);
  }
  if (local_7b2 != '\0') {
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ddCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspfile,"$out.rsp",(allocator<char> *)&comment);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rspcontent,"$in",(allocator<char> *)&comment);
    std::operator+(&deptype,"@",&rspfile);
    pcVar1 = this->LocalGenerator;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&depfile,&(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,psVar7,SHELL);
    std::operator+(&cmdLine,&depfile," -E cmake_ninja_dyndep --tdi=");
    std::operator+(&compilerLauncher,&cmdLine,&tdi);
    std::operator+(&ppRspFile,&compilerLauncher," --lang=");
    std::operator+(&cldeps,&ppRspFile,local_7c0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&cldeps," --dd=$out ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&deptype);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ddCmds,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&cldeps);
    std::__cxx11::string::~string((string *)&ppRspFile);
    std::__cxx11::string::~string((string *)&compilerLauncher);
    std::__cxx11::string::~string((string *)&cmdLine);
    _comment = (pointer)local_5a8;
    local_5a8[0]._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&cldeps,this->LocalGenerator,&ddCmds,(string *)&comment,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar9 = std::operator<<((ostream *)&comment,"Rule to generate ninja dyndep files for ");
    poVar9 = std::operator<<(poVar9,(string *)local_7c0);
    std::operator<<(poVar9,".");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
    poVar9 = std::operator<<((ostream *)&description,"Generating ");
    poVar9 = std::operator<<(poVar9,(string *)local_7c0);
    std::operator<<(poVar9," dyndep file $out");
    pcVar10 = GetGlobalGenerator(this);
    LanguageDyndepRule(&ppRspFile,this,local_7c0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ppCmdLine,"",(allocator<char> *)&compileCmds);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&run_iwyu,"",(allocator<char> *)&ppCmds);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"",&local_7c1);
    cmGlobalNinjaGenerator::AddRule
              (pcVar10,&ppRspFile,&cldeps,&compilerLauncher,&cmdLine,&ppCmdLine,&run_iwyu,&rspfile,
               &rspcontent,&local_7a8,false);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&run_iwyu);
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&cmdLine);
    std::__cxx11::string::~string((string *)&compilerLauncher);
    std::__cxx11::string::~string((string *)&ppRspFile);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
    std::__cxx11::string::~string((string *)&cldeps);
    std::__cxx11::string::~string((string *)&depfile);
    std::__cxx11::string::~string((string *)&deptype);
    std::__cxx11::string::~string((string *)&rspcontent);
    std::__cxx11::string::~string((string *)&rspfile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ddCmds);
  }
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  rspfile._M_string_length = 0;
  rspcontent._M_dataplus._M_p = (pointer)&rspcontent.field_2;
  rspcontent._M_string_length = 0;
  rspfile.field_2._M_local_buf[0] = '\0';
  rspcontent.field_2._M_local_buf[0] = '\0';
  if (responseFlag._M_string_length != 0) {
    std::__cxx11::string::assign((char *)&rspfile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ppRspFile," ",(allocator<char> *)&compilerLauncher);
    std::operator+(&cldeps,&ppRspFile,local_158.Defines);
    std::operator+(&depfile,&cldeps," ");
    std::operator+(&deptype,&depfile,local_158.Includes);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&deptype," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,&flags);
    std::__cxx11::string::operator=((string *)&rspcontent,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&deptype);
    std::__cxx11::string::~string((string *)&depfile);
    std::__cxx11::string::~string((string *)&cldeps);
    std::__cxx11::string::~string((string *)&ppRspFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   &responseFlag,&rspfile);
    std::__cxx11::string::operator=((string *)&flags,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    local_158.Defines = "";
    local_158.Includes = "";
  }
  deptype._M_dataplus._M_p = (pointer)&deptype.field_2;
  deptype._M_string_length = 0;
  depfile._M_dataplus._M_p = (pointer)&depfile.field_2;
  depfile._M_string_length = 0;
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  deptype.field_2._M_local_buf[0] = '\0';
  depfile.field_2._M_local_buf[0] = '\0';
  cldeps.field_2._M_local_buf[0] = '\0';
  if (local_7b1 == '\0') {
    bVar6 = NeedDepTypeMSVC(this,local_7c0);
    if (bVar6) {
      std::__cxx11::string::assign((char *)&deptype);
      depfile._M_string_length = 0;
      *depfile._M_dataplus._M_p = '\0';
      std::__cxx11::string::append((char *)&flags);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                     "CMAKE_NINJA_CMCLDEPS_",local_7c0);
      bVar6 = cmMakefile::IsOn(local_7b0,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
      if (bVar6) {
        bVar6 = cmMakefile::GetIsSourceFileTryCompile(local_7b0);
        if (bVar6) goto LAB_00297dba;
        std::__cxx11::string::assign((char *)&deptype);
        std::__cxx11::string::assign((char *)&depfile);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&description,"CMAKE_C_COMPILER",(allocator<char> *)&compilerLauncher);
        pcVar8 = cmMakefile::GetDefinition(local_7b0,(string *)&description);
        if (pcVar8 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ppRspFile,"CMAKE_CXX_COMPILER",(allocator<char> *)&ppCmds);
          psVar7 = cmMakefile::GetSafeDefinition(local_7b0,&ppRspFile);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ppRspFile,"CMAKE_C_COMPILER",(allocator<char> *)&ppCmds);
          psVar7 = cmMakefile::GetSafeDefinition(local_7b0,&ppRspFile);
        }
        std::__cxx11::string::string((string *)&comment,(string *)psVar7);
        std::__cxx11::string::~string((string *)&ppRspFile);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::assign((char *)&cldeps);
        cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::append((string *)&cldeps);
        std::operator+(&ppCmdLine,"\" ",local_7c0);
        std::operator+(&cmdLine,&ppCmdLine," ");
        std::operator+(&compilerLauncher,&cmdLine,local_158.Source);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &description,&compilerLauncher," $DEP_FILE $out \"");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        std::__cxx11::string::~string((string *)&compilerLauncher);
        std::__cxx11::string::~string((string *)&cmdLine);
        std::__cxx11::string::~string((string *)&ppCmdLine);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&description,"CMAKE_CL_SHOWINCLUDES_PREFIX",
                   (allocator<char> *)&compilerLauncher);
        cmMakefile::GetSafeDefinition(local_7b0,(string *)&description);
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        std::operator+(&compilerLauncher,"\" \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &description,&compilerLauncher,"\" ");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&description);
        psVar7 = &compilerLauncher;
      }
      else {
        std::__cxx11::string::assign((char *)&deptype);
        std::__cxx11::string::assign((char *)&depfile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment
                       ,"CMAKE_DEPFILE_FLAGS_",local_7c0);
        psVar7 = cmMakefile::GetSafeDefinition(local_7b0,(string *)&comment);
        std::__cxx11::string::string((string *)&description,(string *)psVar7);
        if (local_438 != 0) {
          cmsys::SystemTools::ReplaceString((string *)&description,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString((string *)&description,"<OBJECT>","$out");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ppRspFile,"CMAKE_C_COMPILER",(allocator<char> *)&compilerLauncher);
          pcVar8 = cmMakefile::GetDefinition(local_7b0,&ppRspFile);
          cmsys::SystemTools::ReplaceString((string *)&description,"<CMAKE_C_COMPILER>",pcVar8);
          std::__cxx11::string::~string((string *)&ppRspFile);
          std::operator+(&ppRspFile," ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &description);
          std::__cxx11::string::append((string *)&flags);
          std::__cxx11::string::~string((string *)&ppRspFile);
        }
        psVar7 = (string *)&description;
      }
      std::__cxx11::string::~string((string *)psVar7);
      std::__cxx11::string::~string((string *)&comment);
    }
  }
LAB_00297dba:
  pbVar3 = local_7c0;
  local_158.Flags = flags._M_dataplus._M_p;
  local_158.DependencyFile = depfile._M_dataplus._M_p;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = std::operator==(local_7c0,"CUDA");
  if (bVar6) {
    local_5a8[0]._M_local_buf[0] = '\0';
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    _comment = (pointer)local_5a8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&description,"CUDA_SEPARABLE_COMPILATION",
               (allocator<char> *)&compilerLauncher);
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&description);
    std::__cxx11::string::~string((string *)&description);
    if (!bVar6) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&description,"CUDA_PTX_COMPILATION",(allocator<char> *)&compilerLauncher)
      ;
      cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)&description);
      std::__cxx11::string::~string((string *)&description);
    }
    std::__cxx11::string::assign((char *)&comment);
    psVar7 = cmMakefile::GetRequiredDefinition(local_7b0,(string *)&comment);
    cmSystemTools::ExpandListArgument(psVar7,&compileCmds,false);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"CMAKE_",pbVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&description);
    psVar7 = cmMakefile::GetRequiredDefinition(local_7b0,(string *)&comment);
    cmSystemTools::ExpandListArgument(psVar7,&compileCmds,false);
  }
  std::__cxx11::string::~string((string *)&comment);
  compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
  compilerLauncher._M_string_length = 0;
  compilerLauncher.field_2._M_local_buf[0] = '\0';
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((bVar6 = std::operator==(local_7c0,"C"), bVar6 ||
       (bVar6 = std::operator==(local_7c0,"CXX"), bVar6)) ||
      ((bVar6 = std::operator==(local_7c0,"Fortran"), bVar6 ||
       (bVar6 = std::operator==(local_7c0,"CUDA"), bVar6)))))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   local_7c0,"_COMPILER_LAUNCHER");
    pcVar8 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      std::__cxx11::string::assign((char *)&compilerLauncher);
    }
    std::__cxx11::string::~string((string *)&comment);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((bVar6 = std::operator==(local_7c0,"C"), bVar6 ||
      (bVar6 = std::operator==(local_7c0,"CXX"), bVar6)))) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   local_7c0,"_INCLUDE_WHAT_YOU_USE");
    pcVar8 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&comment);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ,local_7c0,"_CLANG_TIDY");
    pcVar11 = cmGeneratorTarget::GetProperty
                        ((this->super_cmCommonTargetGenerator).GeneratorTarget,
                         (string *)&description);
    std::operator+(&cmdLine,local_7c0,"_CPPLINT");
    __s = cmGeneratorTarget::GetProperty
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdLine);
    std::operator+(&ppCmdLine,local_7c0,"_CPPCHECK");
    __s_00 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&ppCmdLine);
    if (((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) ||
       ((((pcVar11 != (char *)0x0 && (*pcVar11 != '\0')) || ((__s != (char *)0x0 && (*__s != '\0')))
         ) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))))) {
      pcVar1 = this->LocalGenerator;
      psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      cmOutputConverter::ConvertToOutputFormat
                (&run_iwyu,
                 &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,psVar7,SHELL);
      std::__cxx11::string::append((char *)&run_iwyu);
      if (compilerLauncher._M_string_length != 0) {
        std::__cxx11::string::append((char *)&run_iwyu);
        cmOutputConverter::EscapeForShell
                  (&local_7a8,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&compilerLauncher,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_7a8);
        compilerLauncher._M_string_length = 0;
        *compilerLauncher._M_dataplus._M_p = '\0';
      }
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&ddCmds,pcVar8,&local_7c1);
        cmOutputConverter::EscapeForShell
                  (&local_7a8,
                   &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&ddCmds,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::__cxx11::string::~string((string *)&ddCmds);
      }
      if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&ddCmds,pcVar11,&local_7c1);
        cmOutputConverter::EscapeForShell
                  (&local_7a8,
                   &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&ddCmds,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::__cxx11::string::~string((string *)&ddCmds);
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&ddCmds,__s,&local_7c1);
        cmOutputConverter::EscapeForShell
                  (&local_7a8,
                   &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&ddCmds,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::__cxx11::string::~string((string *)&ddCmds);
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar1 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&ddCmds,__s_00,&local_7c1);
        cmOutputConverter::EscapeForShell
                  (&local_7a8,
                   &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)&ddCmds,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::__cxx11::string::~string((string *)&ddCmds);
      }
      if ((((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) ||
          ((__s != (char *)0x0 && (*__s != '\0')))) ||
         ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))) {
        std::__cxx11::string::append((char *)&run_iwyu);
      }
      std::__cxx11::string::append((char *)&run_iwyu);
      std::__cxx11::string::insert
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
      std::__cxx11::string::~string((string *)&run_iwyu);
    }
    std::__cxx11::string::~string((string *)&ppCmdLine);
    std::__cxx11::string::~string((string *)&cmdLine);
    std::__cxx11::string::~string((string *)&description);
    std::__cxx11::string::~string((string *)&comment);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (compilerLauncher._M_string_length != 0)) {
    cmdLine._M_dataplus._M_p = (pointer)0x0;
    cmdLine._M_string_length = 0;
    cmdLine.field_2._M_allocated_capacity = 0;
    cmSystemTools::ExpandListArgument
              (&compilerLauncher,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmdLine,true);
    sVar4 = cmdLine._M_string_length;
    for (str = cmdLine._M_dataplus;
        pbVar5 = compileCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, str._M_p != (pointer)sVar4;
        str._M_p = str._M_p + 0x20) {
      cmOutputConverter::EscapeForShell
                ((string *)&comment,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)str._M_p,false,false,false);
      std::__cxx11::string::operator=((string *)str._M_p,(string *)&comment);
      std::__cxx11::string::~string((string *)&comment);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&description,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmdLine," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&description
                   ," ");
    std::__cxx11::string::insert((ulong)pbVar5,(string *)0x0);
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&description);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmdLine);
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::insert
              ((ulong)compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
  }
  pbVar5 = compileCmds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar13 = compileCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar5; pbVar13 = pbVar13 + 1
      ) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&comment,
                   &launcher,pbVar13);
    std::__cxx11::string::operator=((string *)pbVar13,(string *)&comment);
    std::__cxx11::string::~string((string *)&comment);
    pcVar12 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
      pcVar12 = (cmOutputConverter *)0x0;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)
               rulePlaceholderExpander._M_t.
               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar12,
               pbVar13,&local_158);
  }
  _comment = (pointer)local_5a8;
  local_5a8[0]._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            (&cmdLine,this->LocalGenerator,&compileCmds,(string *)&comment,(cmGeneratorTarget *)0x0)
  ;
  std::__cxx11::string::~string((string *)&comment);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  poVar9 = std::operator<<((ostream *)&comment,"Rule for compiling ");
  poVar9 = std::operator<<(poVar9,(string *)local_7c0);
  std::operator<<(poVar9," files.");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&description);
  poVar9 = std::operator<<((ostream *)&description,"Building ");
  poVar9 = std::operator<<(poVar9,(string *)local_7c0);
  std::operator<<(poVar9," object $out");
  pcVar10 = GetGlobalGenerator(this);
  LanguageCompilerRule(&ppCmdLine,this,local_7c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ddCmds,"",&local_7c1);
  cmGlobalNinjaGenerator::AddRule
            (pcVar10,&ppCmdLine,&cmdLine,&run_iwyu,&local_7a8,&depfile,&deptype,&rspfile,&rspcontent
             ,(string *)&ddCmds,false);
  std::__cxx11::string::~string((string *)&ddCmds);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&run_iwyu);
  std::__cxx11::string::~string((string *)&ppCmdLine);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&description);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::__cxx11::string::~string((string *)&cmdLine);
  std::__cxx11::string::~string((string *)&compilerLauncher);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds);
  std::__cxx11::string::~string((string *)&cldeps);
  std::__cxx11::string::~string((string *)&depfile);
  std::__cxx11::string::~string((string *)&deptype);
  std::__cxx11::string::~string((string *)&rspcontent);
  std::__cxx11::string::~string((string *)&rspfile);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&tdi);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr(&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  if (lang == "Swift") {
    vars.SwiftAuxiliarySources = "$SWIFT_AUXILIARY_SOURCES";
    vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
    vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
    vars.SwiftPartialModule = "$SWIFT_PARTIAL_MODULE";
    vars.SwiftPartialDoc = "$SWIFT_PARTIAL_DOC";
  }

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = !(lang == "RC" || lang == "CUDA");
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  if (explicitPP) {
    // Lookup the explicit preprocessing rule.
    std::string const ppVar = "CMAKE_" + lang + "_PREPROCESS_SOURCE";
    std::string const& ppCmd =
      this->GetMakefile()->GetRequiredDefinition(ppVar);

    // Explicit preprocessing always uses a depfile.
    std::string const ppDeptype; // no deps= for multiple outputs
    std::string const ppDepfile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = ppDepfile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    std::string ppRspFile;
    std::string ppRspContent;
    if (!responseFlag.empty()) {
      ppRspFile = "$RSP_FILE";
      ppRspContent = std::string(" ") + ppVars.Defines + " " +
        ppVars.Includes + " " + ppFlags;
      ppFlags = responseFlag + ppRspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    cmSystemTools::ExpandListArgument(ppCmd, ppCmds);

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ppCmds.push_back(
      cmake +
      " -E cmake_ninja_depends"
      " --tdi=" +
      tdi + " --lang=" + lang +
      " --pp=$out"
      " --dep=$DEP_FILE" +
      (needDyndep ? " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE" : ""));

    std::string const ppCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    std::ostringstream ppComment;
    ppComment << "Rule for preprocessing " << lang << " files.";
    std::ostringstream ppDesc;
    ppDesc << "Building " << lang << " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguagePreprocessRule(lang), ppCmdLine, ppDesc.str(),
      ppComment.str(), ppDepfile, ppDeptype, ppRspFile, ppRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    std::vector<std::string> ddCmds;

    // Command line length is almost always limited -> use response file for
    // dyndep rules
    std::string ddRspFile = "$out.rsp";
    std::string ddRspContent = "$in";
    std::string ddInput = "@" + ddRspFile;

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string const cmake = this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);
    ddCmds.push_back(cmake +
                     " -E cmake_ninja_dyndep"
                     " --tdi=" +
                     tdi + " --lang=" + lang +
                     " --dd=$out"
                     " " +
                     ddInput);

    std::string const ddCmdLine =
      this->GetLocalGenerator()->BuildCommandLine(ddCmds);

    std::ostringstream ddComment;
    ddComment << "Rule to generate ninja dyndep files for " << lang << ".";
    std::ostringstream ddDesc;
    ddDesc << "Generating " << lang << " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(
      this->LanguageDyndepRule(lang), ddCmdLine, ddDesc.str(), ddComment.str(),
      /*depfile*/ "",
      /*deps*/ "", ddRspFile, ddRspContent,
      /*restat*/ "",
      /*generator*/ false);
  }

  // If using a response file, move defines, includes, and flags into it.
  std::string rspfile;
  std::string rspcontent;
  if (!responseFlag.empty()) {
    rspfile = "$RSP_FILE";
    rspcontent =
      std::string(" ") + vars.Defines + " " + vars.Includes + " " + flags;
    flags = responseFlag + rspfile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string deptype;
  std::string depfile;
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    deptype = "msvc";
    depfile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      deptype = "gcc";
      depfile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    deptype = "gcc";
    depfile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = depfile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    for (std::string& i : args) {
      i = this->LocalGenerator->EscapeForShell(i);
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  std::ostringstream comment;
  comment << "Rule for compiling " << lang << " files.";
  std::ostringstream description;
  description << "Building " << lang << " object $out";
  this->GetGlobalGenerator()->AddRule(
    this->LanguageCompilerRule(lang), cmdLine, description.str(),
    comment.str(), depfile, deptype, rspfile, rspcontent,
    /*restat*/ "",
    /*generator*/ false);
}